

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive3_test.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* re2::InterestingUTF8_abi_cxx11_(void)

{
  int iVar1;
  re2 local_b8 [36];
  int local_94;
  re2 local_90 [4];
  int j_2;
  int local_70;
  int local_6c;
  int j_1;
  int i_1;
  int local_48;
  int j;
  re2 local_38 [36];
  int local_14;
  int i;
  
  if ((InterestingUTF8[abi:cxx11]()::v_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&InterestingUTF8[abi:cxx11]()::v_abi_cxx11_), iVar1 != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&InterestingUTF8[abi:cxx11]()::v_abi_cxx11_);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,&InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InterestingUTF8[abi:cxx11]()::v_abi_cxx11_);
  }
  if ((InterestingUTF8::init & 1U) == 0) {
    InterestingUTF8::init = true;
    for (local_14 = 1; local_14 < 0x100; local_14 = local_14 + 1) {
      UTF8_abi_cxx11_(local_38,local_14);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,(value_type *)local_38);
      std::__cxx11::string::~string((string *)local_38);
    }
    for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
      UTF8_abi_cxx11_((re2 *)&j_1,local_48 + 0x100);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,(value_type *)&j_1);
      std::__cxx11::string::~string((string *)&j_1);
    }
    for (local_6c = 0x200; local_6c < 0x10ffff; local_6c = local_6c << 1) {
      for (local_70 = -8; local_70 < 8; local_70 = local_70 + 1) {
        UTF8_abi_cxx11_(local_90,local_6c + local_70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,(value_type *)local_90);
        std::__cxx11::string::~string((string *)local_90);
      }
    }
    for (local_94 = -8; local_94 < 1; local_94 = local_94 + 1) {
      UTF8_abi_cxx11_(local_b8,local_94 + 0x10ffff);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&InterestingUTF8[abi:cxx11]()::v_abi_cxx11_,(value_type *)local_b8);
      std::__cxx11::string::~string((string *)local_b8);
    }
  }
  return &InterestingUTF8[abi:cxx11]()::v_abi_cxx11_;
}

Assistant:

static const vector<string>& InterestingUTF8() {
  static bool init;
  static vector<string> v;

  if (init)
    return v;

  init = true;
  // All the Latin1 equivalents are interesting.
  for (int i = 1; i < 256; i++)
    v.push_back(UTF8(i));

  // After that, the codes near bit boundaries are
  // interesting, because they span byte sequence lengths.
  for (int j = 0; j < 8; j++)
    v.push_back(UTF8(256 + j));
  for (int i = 512; i < Runemax; i <<= 1)
    for (int j = -8; j < 8; j++)
      v.push_back(UTF8(i + j));

  // The codes near Runemax, including Runemax itself, are interesting.
  for (int j = -8; j <= 0; j++)
    v.push_back(UTF8(Runemax + j));

  return v;
}